

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

void TestConstExpr::ConstExprTest(void)

{
  int iVar1;
  char *p2;
  char *p1;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs;
  char *p1_00;
  
  ConstExprTestT<char>();
  ConstExprTestT<signed_char>();
  ConstExprTestT<unsigned_char>();
  ConstExprTestT<short>();
  ConstExprTestT<unsigned_short>();
  ConstExprTestT<int>();
  ConstExprTestT<unsigned_int>();
  ConstExprTestT<long>();
  ConstExprTestT<unsigned_long>();
  ConstExprTestT<long_long>();
  ConstExprTestT<unsigned_long_long>();
  p1_00 = (char *)0x1;
  lhs.m_int = 0;
  if ((ConstExprTest()::pt == '\0') &&
     (iVar1 = __cxa_guard_acquire(&ConstExprTest()::pt), iVar1 != 0)) {
    ConstExprTest::pt = SafePtrDiff<char>(p1_00,lhs.m_int);
    __cxa_guard_release(&ConstExprTest()::pt);
  }
  ::operator>(lhs,(int)((ulong)ConstExprTest::pt.m_int >> 0x20));
  return;
}

Assistant:

void ConstExprTest()
	{
		ConstExprTestT<char>();
		ConstExprTestT<signed char>();
		ConstExprTestT<unsigned char>();
		ConstExprTestT<signed short>();
		ConstExprTestT<unsigned short>();
		ConstExprTestT<signed int>();
		ConstExprTestT<unsigned int>();
		ConstExprTestT<signed long>();
		ConstExprTestT<unsigned long>();
		ConstExprTestT<signed long long>();
		ConstExprTestT<unsigned long long>();

		// Catch the SafePtrDiff function, since it is marked. Can't think of a scenario for this being constexpr, though.
		const char* p1 = (char*)1;
		const char* p2 = nullptr;

		static const SafeInt<ptrdiff_t> pt = SafePtrDiff(p1, p2);
		if (pt > 0)
			return;
	}